

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O2

ConstantValue *
slang::ast::Bitstream::resizeToRange
          (ConstantValue *__return_storage_ptr__,ConstantValue *value,ConstantRange range,
          ConstantValue *defaultValue,bool keepArray)

{
  __index_type _Var1;
  SVQueue *pSVar2;
  int32_t diff;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *__rhs;
  variant_alternative_t<8UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar6;
  size_type sVar7;
  int32_t diff_1;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong __n;
  uint uVar12;
  span<slang::ConstantValue,_18446744073709551615UL> sVar13;
  allocator_type local_149;
  ConstantValue *local_148;
  pointer local_140;
  Elements sliceValue;
  _Self local_d8;
  const_iterator local_b8;
  _Self local_98;
  _Self local_70;
  _Self local_50;
  
  uVar4 = range.left;
  uVar9 = range.right;
  iVar3 = uVar4 - uVar9;
  if (iVar3 == 0 && !keepArray) {
    sVar5 = ConstantValue::size(value);
    if ((ulong)(long)(int)uVar4 < sVar5) {
      __rhs = (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               *)ConstantValue::at(value,(long)(int)uVar4);
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)__return_storage_ptr__,__rhs);
      return __return_storage_ptr__;
    }
LAB_001e280b:
    std::__detail::__variant::
    _Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)__return_storage_ptr__,
                      (_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)defaultValue);
  }
  else {
    uVar12 = uVar4;
    if ((int)uVar9 < (int)uVar4) {
      uVar12 = uVar9;
    }
    local_148 = defaultValue;
    if ((int)uVar12 < 1) {
      iVar8 = -iVar3;
      if (0 < iVar3) {
        iVar8 = iVar3;
      }
      sVar5 = ConstantValue::size(value);
      defaultValue = value;
      if (sVar5 == iVar8 + 1) goto LAB_001e280b;
    }
    iVar3 = uVar4 - uVar9;
    if (iVar3 != 0 && (int)uVar9 <= (int)uVar4) {
      uVar9 = uVar4;
    }
    sVar5 = ConstantValue::size(value);
    uVar11 = uVar9 + 1;
    uVar4 = (uint)sVar5;
    __n = (ulong)uVar11;
    if (uVar4 <= uVar11) {
      __n = sVar5 & 0xffffffff;
    }
    uVar10 = 0;
    if (uVar4 <= uVar9) {
      uVar10 = uVar11 - uVar4;
    }
    _Var1 = *(__index_type *)
             ((long)&(value->value).
                     super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             + 0x20);
    if (_Var1 == '\b') {
      pvVar6 = std::
               get<8ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                         (&value->value);
      pSVar2 = pvVar6->ptr;
      local_d8._M_cur =
           (pSVar2->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
           super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
      local_d8._M_first =
           (pSVar2->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
           super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
           super__Deque_impl_data._M_start._M_first;
      local_d8._M_last =
           (pSVar2->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
           super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
           super__Deque_impl_data._M_start._M_last;
      local_d8._M_node =
           (pSVar2->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
           super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
           super__Deque_impl_data._M_start._M_node;
      std::operator+(&local_50,&local_d8,(ulong)uVar12);
      pSVar2 = pvVar6->ptr;
      local_98._M_cur =
           (pSVar2->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
           super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
      local_98._M_first =
           (pSVar2->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
           super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
           super__Deque_impl_data._M_start._M_first;
      local_98._M_last =
           (pSVar2->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
           super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
           super__Deque_impl_data._M_start._M_last;
      local_98._M_node =
           (pSVar2->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
           super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
           super__Deque_impl_data._M_start._M_node;
      std::operator+(&local_70,&local_98,__n);
      SVQueue::
      deque<std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue_const&,slang::SVQueue::deque*>,void>
                ((SVQueue *)&sliceValue,&local_50,&local_70,&local_149);
      std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::insert
                ((iterator *)&local_d8,
                 (deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)&sliceValue,
                 &local_b8,(ulong)uVar10,local_148);
      sVar7 = std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                        ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                         &sliceValue);
      iVar8 = -iVar3;
      if (0 < iVar3) {
        iVar8 = iVar3;
      }
      if (sVar7 != iVar8 + 1) {
        assert::assertFailed
                  ("sliceValue.size() == range.width()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Bitstream.cpp"
                   ,0x35b,
                   "static ConstantValue slang::ast::Bitstream::resizeToRange(ConstantValue &&, ConstantRange, ConstantValue, bool)"
                  );
      }
      ConstantValue::ConstantValue(__return_storage_ptr__,(SVQueue *)&sliceValue);
      std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~deque
                ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)&sliceValue);
    }
    else {
      if (_Var1 != '\x05') {
        assert::assertFailed
                  ("value.isQueue()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Bitstream.cpp"
                   ,0x357,
                   "static ConstantValue slang::ast::Bitstream::resizeToRange(ConstantValue &&, ConstantRange, ConstantValue, bool)"
                  );
      }
      sVar13 = ConstantValue::elements(value);
      local_140 = sVar13.data_;
      sliceValue.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      sliceValue.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      sliceValue.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar8 = -iVar3;
      if (0 < iVar3) {
        iVar8 = iVar3;
      }
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::reserve
                (&sliceValue,(ulong)(iVar8 + 1));
      std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>::
      insert<slang::ConstantValue_const*,void>
                ((vector<slang::ConstantValue,std::allocator<slang::ConstantValue>> *)&sliceValue,
                 (const_iterator)
                 sliceValue.
                 super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                 _M_impl.super__Vector_impl_data._M_finish,local_140 + uVar12,local_140 + __n);
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::insert
                (&sliceValue,
                 (const_iterator)
                 sliceValue.
                 super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ulong)uVar10,local_148);
      if (((long)sliceValue.
                 super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)sliceValue.
                super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x28 != (ulong)(iVar8 + 1)) {
        assert::assertFailed
                  ("sliceValue.size() == range.width()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Bitstream.cpp"
                   ,0x353,
                   "static ConstantValue slang::ast::Bitstream::resizeToRange(ConstantValue &&, ConstantRange, ConstantValue, bool)"
                  );
      }
      *(pointer *)
       &(__return_storage_ptr__->value).
        super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           = sliceValue.
             super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl
             .super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 8) = sliceValue.
              super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
              _M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&(__return_storage_ptr__->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 0x10) = sliceValue.
                 super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      sliceValue.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      sliceValue.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      sliceValue.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 0x20) = '\x05';
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector(&sliceValue)
      ;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ConstantValue Bitstream::resizeToRange(ConstantValue&& value, ConstantRange range,
                                       ConstantValue defaultValue, bool keepArray) {
    if (range.left == range.right && !keepArray) {
        if (size_t(range.left) >= value.size())
            return defaultValue;
        else
            return std::move(value).at(size_t(range.left));
    }

    if (range.lower() > 0 || range.width() != value.size()) {
        auto upper = static_cast<uint32_t>(range.upper());
        auto lower = static_cast<uint32_t>(range.lower());
        auto size = static_cast<uint32_t>(value.size());
        auto more = upper >= size ? upper - size + 1 : 0;
        upper = std::min(upper + 1, size);

        if (value.isUnpacked()) {
            const auto old = value.elements();
            ConstantValue::Elements sliceValue;
            sliceValue.reserve(range.width());
            sliceValue.insert(sliceValue.end(), old.cbegin() + lower, old.cbegin() + upper);
            sliceValue.insert(sliceValue.end(), more, defaultValue);
            ASSERT(sliceValue.size() == range.width());
            return sliceValue;
        }
        else {
            ASSERT(value.isQueue());
            const auto& old = value.queue();
            SVQueue sliceValue(old->cbegin() + lower, old->cbegin() + upper);
            sliceValue.insert(sliceValue.end(), more, defaultValue);
            ASSERT(sliceValue.size() == range.width());
            return sliceValue;
        }
    }

    return std::move(value);
}